

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argagg.hpp
# Opt level: O1

string * argagg::wrap_line(string *__return_storage_ptr__,string *single_line,size_t wrap_width)

{
  pointer pcVar1;
  undefined1 *puVar2;
  string *psVar3;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var4;
  long lVar5;
  long *plVar6;
  size_type *psVar7;
  ulong uVar8;
  ulong uVar9;
  string line;
  string result;
  string indent;
  string local_e8;
  undefined1 *local_c8;
  ulong local_c0;
  undefined1 local_b8 [16];
  long local_a8;
  string local_a0;
  string *local_80;
  size_t local_78;
  undefined1 *local_70;
  undefined8 local_68;
  undefined1 local_60 [16];
  string local_50;
  
  local_78 = wrap_width;
  local_a8 = std::__cxx11::string::find_first_not_of((char *)single_line,0x10e5ce,0);
  if (local_a8 == -1) {
    local_a8 = 0;
  }
  local_c8 = local_b8;
  pcVar1 = (single_line->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_c8,pcVar1,pcVar1 + single_line->_M_string_length);
  puVar2 = local_c8;
  _Var4 = std::
          __find_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_pred<argagg::lstrip(std::__cxx11::string_const&)::_lambda(int)_1_>>
                    (local_c8,local_c8 + local_c0);
  uVar9 = (long)puVar2 - (long)local_c8;
  if (local_c8 + local_c0 == _Var4._M_current) {
    local_c8[uVar9] = 0;
    local_c0 = uVar9;
  }
  else {
    std::__cxx11::string::_M_erase((ulong)&local_c8,uVar9);
  }
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_80 = __return_storage_ptr__;
  std::__cxx11::string::_M_construct((ulong)&local_50,(char)local_a8);
  local_70 = local_60;
  local_68 = 0;
  local_60[0] = 0;
  uVar9 = 0;
  uVar8 = 0;
  do {
    lVar5 = std::__cxx11::string::find_first_of((char *)&local_c8,0x10e5ce,uVar9);
    if (lVar5 != -1) {
      if (local_78 + uVar8 < (ulong)(local_a8 + lVar5)) {
        std::__cxx11::string::substr((ulong)&local_a0,(ulong)&local_c8);
        construct_line(&local_e8,&local_50,&local_a0);
        std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_e8._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
          operator_delete(local_e8._M_dataplus._M_p);
        }
        uVar8 = uVar9;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
          operator_delete(local_a0._M_dataplus._M_p);
        }
      }
      uVar9 = lVar5 + 1;
    }
  } while (lVar5 != -1);
  std::__cxx11::string::substr((ulong)&local_a0,(ulong)&local_c8);
  construct_line(&local_e8,&local_50,&local_a0);
  psVar3 = local_80;
  plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_e8,0,(char *)0x0,(ulong)local_70);
  (psVar3->_M_dataplus)._M_p = (pointer)&psVar3->field_2;
  psVar7 = (size_type *)(plVar6 + 2);
  if ((size_type *)*plVar6 == psVar7) {
    lVar5 = plVar6[3];
    (psVar3->field_2)._M_allocated_capacity = *psVar7;
    *(long *)((long)&psVar3->field_2 + 8) = lVar5;
  }
  else {
    (psVar3->_M_dataplus)._M_p = (pointer)*plVar6;
    (psVar3->field_2)._M_allocated_capacity = *psVar7;
  }
  psVar3->_M_string_length = plVar6[1];
  *plVar6 = (long)psVar7;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p);
  }
  if (local_70 != local_60) {
    operator_delete(local_70);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if (local_c8 != local_b8) {
    operator_delete(local_c8);
  }
  return psVar3;
}

Assistant:

inline
std::string wrap_line(const std::string& single_line,
                      const std::size_t wrap_width)
{
  auto indentation_spaces = single_line.find_first_not_of(" ");
  if (indentation_spaces == std::string::npos) {
    indentation_spaces = 0;
  }

  const auto line = lstrip(single_line);
  const auto indent = std::string(indentation_spaces, ' ');

  std::string result;

  std::size_t position = 0;
  std::size_t line_start = 0;
  while (true) {
    const auto new_position = line.find_first_of(" ", position);
    if (new_position == std::string::npos) {
      break;
    }

    if (new_position + indentation_spaces > line_start + wrap_width) {
      result += construct_line(
        indent, line.substr(line_start, position - line_start - 1));

      line_start = position;
    }

    position = new_position + 1;
  }

  return result + construct_line(indent, line.substr(line_start));
}